

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall
soul::RewritingASTVisitor::
replaceArray<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
          (RewritingASTVisitor *this,
          vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
          *array)

{
  pointer ppVar1;
  Function *pFVar2;
  size_t i;
  ulong uVar3;
  pool_ref<soul::AST::Function> newObject;
  Function *local_38;
  
  for (uVar3 = 0;
      ppVar1 = (array->
               super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(array->
                            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pFVar2 = ppVar1[uVar3].object;
    visitAs<soul::AST::Function>
              ((RewritingASTVisitor *)&local_38,(pool_ref<soul::AST::Function> *)this);
    if (pFVar2 != local_38) {
      (array->
      super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar3].object = local_38;
      this->itemsReplaced = this->itemsReplaced + 1;
    }
  }
  return;
}

Assistant:

void replaceArray (ArrayType& array)
    {
        // this gubbins is all needed to survive cases where a visit causes the list to be mutated
        for (size_t i = 0; i < array.size(); ++i)
        {
            auto oldObject = array[i];
            auto newObject = visitAs<typename ArrayType::value_type::ObjectType> (oldObject);

            if (oldObject != newObject)
            {
                array[i] = newObject;
                ++itemsReplaced;
            }
        }
    }